

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unidim-lipm-dcm-estimator.cpp
# Opt level: O0

void __thiscall
stateObservation::UnidimLipmDcmEstimator::setInputs
          (UnidimLipmDcmEstimator *this,double dcm,double zmp)

{
  Scalar SVar1;
  Scalar *pSVar2;
  Matrix<double,__1,_1,_0,__1,_1> local_60 [2];
  Matrix<double,__1,_1,_0,__1,_1> local_40;
  DenseCoeffsBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1> local_30 [8];
  Vector1 y;
  Vector1 u;
  double zmp_local;
  double dcm_local;
  UnidimLipmDcmEstimator *this_local;
  
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::Matrix((Matrix<double,_1,_1,_0,_1,_1> *)&y);
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::Matrix((Matrix<double,_1,_1,_0,_1,_1> *)local_30);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>::operator()(local_30,0);
  *pSVar2 = dcm;
  SVar1 = this->previousZmp_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1> *)&y,0);
  *pSVar2 = SVar1;
  this->previousZmp_ = zmp;
  Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,1,1,0,1,1>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_40,
             (EigenBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)local_30);
  ZeroDelayObserver::pushMeasurement((ZeroDelayObserver *)&this->filter_,(MeasureVector *)&local_40)
  ;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_40);
  Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,1,1,0,1,1>>
            ((Matrix<double,_1,1,0,_1,1> *)local_60,
             (EigenBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)&y);
  ZeroDelayObserver::pushInput((ZeroDelayObserver *)&this->filter_,(InputVector *)local_60);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(local_60);
  return;
}

Assistant:

void UnidimLipmDcmEstimator::setInputs(double dcm, double zmp)
{
  Vector1 u;
  Vector1 y;

  y(0) = dcm;

  /// The prediction of the state depends on the previous value of the ZMP
  u(0) = previousZmp_;
  previousZmp_ = zmp;

  filter_.pushMeasurement(y);
  filter_.pushInput(u);
}